

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::PerVertexValidationTest::runPipelineObjectValidationTestMode
          (PerVertexValidationTest *this,_test_iteration iteration)

{
  ostringstream *this_00;
  _shader_stage shader_stage;
  string *psVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  ContextType context_type;
  int iVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar9;
  GLuint *pGVar10;
  char *this_01;
  _shader_stage used_shader_stages;
  ContextType min_context_type;
  GLint link_status;
  PerVertexValidationTest *local_1330;
  char *body_raw_ptr;
  _shader_stage _Stack_1320;
  GLint validate_status;
  _shader_program shader_programs [5];
  string local_1278;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  undefined1 local_11b8 [384];
  char info_log [4096];
  long lVar8;
  
  context_type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  body_raw_ptr = (char *)0x0;
  fs_body._M_dataplus._M_p = (pointer)&fs_body.field_2;
  fs_body._M_string_length = 0;
  fs_body.field_2._M_local_buf[0] = '\0';
  gs_body._M_dataplus._M_p = (pointer)&gs_body.field_2;
  gs_body._M_string_length = 0;
  gs_body.field_2._M_local_buf[0] = '\0';
  tc_body._M_dataplus._M_p = (pointer)&tc_body.field_2;
  tc_body._M_string_length = 0;
  te_body._M_dataplus._M_p = (pointer)&te_body.field_2;
  te_body._M_string_length = 0;
  min_context_type.super_ApiType.m_bits = (ApiType)0x300;
  tc_body.field_2._M_local_buf[0] = '\0';
  te_body.field_2._M_local_buf[0] = '\0';
  vs_body._M_dataplus._M_p = (pointer)&vs_body.field_2;
  vs_body._M_string_length = 0;
  vs_body.field_2._M_local_buf[0] = '\0';
  shader_programs[0].body_ptr = &fs_body;
  shader_programs[0].po_id_ptr = &this->m_fs_po_id;
  shader_programs[0].shader_stage = SHADER_STAGE_FRAGMENT;
  shader_programs[0].shader_stage_bit_gl = 2;
  shader_programs[0].shader_stage_gl = 0x8b30;
  shader_programs[1].body_ptr = &gs_body;
  shader_programs[1].po_id_ptr = &this->m_gs_po_id;
  shader_programs[1].shader_stage = SHADER_STAGE_GEOMETRY;
  shader_programs[1].shader_stage_bit_gl = 4;
  shader_programs[1].shader_stage_gl = 0x8dd9;
  shader_programs[2].body_ptr = &tc_body;
  shader_programs[2].po_id_ptr = &this->m_tc_po_id;
  shader_programs[2].shader_stage = SHADER_STAGE_TESSELLATION_CONTROL;
  shader_programs[2].shader_stage_bit_gl = 8;
  shader_programs[2].shader_stage_gl = 0x8e88;
  shader_programs[3].body_ptr = &te_body;
  shader_programs[3].po_id_ptr = &this->m_te_po_id;
  shader_programs[3].shader_stage = SHADER_STAGE_TESSELLATION_EVALUATION;
  shader_programs[3].shader_stage_bit_gl = 0x10;
  shader_programs[3].shader_stage_gl = 0x8e87;
  shader_programs[4].body_ptr = &vs_body;
  shader_programs[4].po_id_ptr = &this->m_vs_po_id;
  shader_programs[4].shader_stage = SHADER_STAGE_VERTEX;
  shader_programs[4].shader_stage_bit_gl = 1;
  shader_programs[4].shader_stage_gl = 0x8b31;
  local_1330 = this;
  getTestIterationProperties
            (this,context_type,iteration,&min_context_type,&used_shader_stages,
             shader_programs[1].body_ptr,shader_programs[2].body_ptr,shader_programs[3].body_ptr,
             shader_programs[4].body_ptr);
  bVar4 = glu::contextSupports(context_type,min_context_type.super_ApiType.m_bits & 0x3ff);
  bVar3 = true;
  if (bVar4) {
    for (lVar9 = 0x18; lVar9 != 0xb8; lVar9 = lVar9 + 0x20) {
      shader_stage = *(_shader_stage *)((long)&_Stack_1320 + lVar9);
      if ((shader_stage & used_shader_stages) != 0) {
        psVar1 = *(string **)((long)&local_1330 + lVar9);
        body_raw_ptr = *(char **)psVar1;
        uVar6 = (**(code **)(lVar8 + 0x3f8))
                          (*(undefined4 *)((long)&shader_programs[0].body_ptr + lVar9),1,
                           &body_raw_ptr);
        puVar2 = *(undefined4 **)((long)&body_raw_ptr + lVar9);
        *puVar2 = uVar6;
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glCreateShaderProgramv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa3c);
        (**(code **)(lVar8 + 0x9d8))(*puVar2,0x8b82,&link_status);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa3f);
        if (link_status != 1) {
          bVar3 = iteration == TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED || (int)iteration < 0x1c;
          if (iteration != TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED && (int)iteration >= 0x1c) {
            (**(code **)(lVar8 + 0x988))(*puVar2,0x1000,0,info_log);
            local_11b8._0_8_ =
                 ((local_1330->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_11b8 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            this_01 = "The separate ";
            std::operator<<((ostream *)this_00,"The separate ");
            getShaderStageName_abi_cxx11_
                      (&local_1278,(PerVertexValidationTest *)this_01,shader_stage);
            std::operator<<((ostream *)this_00,(string *)&local_1278);
            std::operator<<((ostream *)this_00,
                            " program failed to link, even though the shader body is valid.\n\nBody:\n>>\n"
                           );
            std::operator<<((ostream *)this_00,psVar1);
            std::operator<<((ostream *)this_00,"<<\nInfo log\n>>\n");
            std::operator<<((ostream *)this_00,info_log);
            std::operator<<((ostream *)this_00,"<<\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_11b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_1278);
            std::__cxx11::ostringstream::~ostringstream(this_00);
          }
          goto LAB_00aee92e;
        }
      }
    }
    pGVar10 = &local_1330->m_pipeline_id;
    (**(code **)(lVar8 + 0x6d8))(1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenProgramPipelines() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa60);
    (**(code **)(lVar8 + 0x98))(*pGVar10);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glBindProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa63);
    for (lVar9 = 0x14; lVar9 != 0xb4; lVar9 = lVar9 + 0x20) {
      if ((*(_shader_stage *)((long)shader_programs + lVar9 + -4) & used_shader_stages) != 0) {
        (**(code **)(lVar8 + 0x1688))
                  (*pGVar10,*(undefined4 *)((long)&shader_programs[0].body_ptr + lVar9),
                   **(undefined4 **)((long)&body_raw_ptr + lVar9 + 4));
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"glUseProgramStages() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa6d);
      }
    }
    (**(code **)(lVar8 + 0x1698))(*pGVar10);
    bVar3 = true;
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glValidateProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa72);
    (**(code **)(lVar8 + 0x9a0))(*pGVar10,0x8b83,&validate_status);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa75);
  }
LAB_00aee92e:
  std::__cxx11::string::~string((string *)&vs_body);
  std::__cxx11::string::~string((string *)&te_body);
  std::__cxx11::string::~string((string *)&tc_body);
  std::__cxx11::string::~string((string *)&gs_body);
  std::__cxx11::string::~string((string *)&fs_body);
  return bVar3;
}

Assistant:

bool PerVertexValidationTest::runPipelineObjectValidationTestMode(_test_iteration iteration)
{
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= false;

	const char*		 body_raw_ptr	= NULL;
	glw::GLenum		 expected_result = getProgramPipelineValidationExpectedResult();
	std::string		 fs_body;
	std::string		 gs_body;
	glw::GLint		 link_status;
	glu::ContextType min_context_type;
	std::string		 tc_body;
	std::string		 te_body;
	_shader_stage	used_shader_stages;
	glw::GLint		 validate_status;
	glw::GLint		 validate_expected_status;
	std::string		 vs_body;

	struct _shader_program
	{
		std::string*  body_ptr;
		glw::GLuint*  po_id_ptr;
		_shader_stage shader_stage;
		glw::GLenum   shader_stage_bit_gl;
		glw::GLenum   shader_stage_gl;
	} shader_programs[] = {
		{ &fs_body, &m_fs_po_id, SHADER_STAGE_FRAGMENT, GL_FRAGMENT_SHADER_BIT, GL_FRAGMENT_SHADER },
		{ &gs_body, &m_gs_po_id, SHADER_STAGE_GEOMETRY, GL_GEOMETRY_SHADER_BIT, GL_GEOMETRY_SHADER },
		{ &tc_body, &m_tc_po_id, SHADER_STAGE_TESSELLATION_CONTROL, GL_TESS_CONTROL_SHADER_BIT,
		  GL_TESS_CONTROL_SHADER },
		{ &te_body, &m_te_po_id, SHADER_STAGE_TESSELLATION_EVALUATION, GL_TESS_EVALUATION_SHADER_BIT,
		  GL_TESS_EVALUATION_SHADER },
		{ &vs_body, &m_vs_po_id, SHADER_STAGE_VERTEX, GL_VERTEX_SHADER_BIT, GL_VERTEX_SHADER },
	};
	const unsigned int n_shader_programs =
		static_cast<const unsigned int>(sizeof(shader_programs) / sizeof(shader_programs[0]));

	/* Make sure the test iteration can actually be run under the running rendering context
	 * version.
	 */
	getTestIterationProperties(context_type, iteration, &min_context_type, &used_shader_stages, &gs_body, &tc_body,
							   &te_body, &vs_body);

	if (!glu::contextSupports(context_type, min_context_type.getAPI()))
	{
		result = true;

		goto end;
	}

	/* Set up shader program objects. All shader bodies by themselves are valid, so all shaders should
	 * link just fine. */
	for (unsigned int n_shader_program = 0; n_shader_program < n_shader_programs; ++n_shader_program)
	{
		_shader_program& current_shader_program = shader_programs[n_shader_program];

		if ((used_shader_stages & current_shader_program.shader_stage) != 0)
		{
			body_raw_ptr = current_shader_program.body_ptr->c_str();
			*current_shader_program.po_id_ptr =
				gl.createShaderProgramv(current_shader_program.shader_stage_gl, 1, /* count */
										&body_raw_ptr);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

			gl.getProgramiv(*current_shader_program.po_id_ptr, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			if (link_status != GL_TRUE)
			{
				char info_log[4096];

				if (!isShaderProgramLinkingFailureExpected(iteration))
				{
					gl.getProgramInfoLog(*current_shader_program.po_id_ptr, sizeof(info_log), DE_NULL, /* length */
										 info_log);

					m_testCtx.getLog() << tcu::TestLog::Message << "The separate "
									   << getShaderStageName(current_shader_program.shader_stage)
									   << " program "
										  "failed to link, even though the shader body is valid.\n"
										  "\n"
										  "Body:\n>>\n"
									   << *current_shader_program.body_ptr << "<<\nInfo log\n>>\n"
									   << info_log << "<<\n"
									   << tcu::TestLog::EndMessage;
				}
				else
				{
					result = true;
				}

				goto end;
			} /* if (link_status != GL_TRUE) */
		}	 /* for (all shader programs) */
	}		  /* for (all shader stages) */

	/* Now that all shader programs are ready, set up a test-specific pipeline object and validate it. */
	gl.genProgramPipelines(1, &m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.bindProgramPipeline(m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	for (unsigned int n_shader_program = 0; n_shader_program < n_shader_programs; ++n_shader_program)
	{
		_shader_program& current_shader_program = shader_programs[n_shader_program];

		if ((used_shader_stages & current_shader_program.shader_stage) != 0)
		{
			gl.useProgramStages(m_pipeline_id, current_shader_program.shader_stage_bit_gl,
								*current_shader_program.po_id_ptr);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");
		}
	} /* for (all shader programs) */

	gl.validateProgramPipeline(m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() call failed.");

	gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

	if (VALIDATION_RESULT_UNDEFINED != expected_result)
	{
		switch (expected_result)
		{
		case VALIDATION_RESULT_FALSE:
			validate_expected_status = GL_FALSE;
			break;
		case VALIDATION_RESULT_TRUE:
			validate_expected_status = GL_TRUE;
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		if (validate_status != validate_expected_status)
		{
			tcu::MessageBuilder message = m_testCtx.getLog().message();

			if (GL_FALSE == validate_expected_status)
			{
				message << "A pipeline object was validated successfully, even though one";
			}
			else
			{
				message << "A pipeline object was validated negatively, even though none";
			}

			message << " of the failure reasons given by spec was applicable.\n"
					<< "\n"
					   "Fragment shader body:\n>>\n"
					<< ((shader_programs[0].body_ptr->length() > 0) ? *shader_programs[0].body_ptr : "[not used]")
					<< "\n<<\nGeometry shader body:\n>>\n"
					<< ((shader_programs[1].body_ptr->length() > 0) ? *shader_programs[1].body_ptr : "[not used]")
					<< "\n<<\nTessellation control shader body:\n>>\n"
					<< ((shader_programs[2].body_ptr->length() > 0) ? *shader_programs[2].body_ptr : "[not used]")
					<< "\n<<\nTessellation evaluation shader body:\n>>\n"
					<< ((shader_programs[3].body_ptr->length() > 0) ? *shader_programs[3].body_ptr : "[not used]")
					<< "\n<<\nVertex shader body:\n>>\n"
					<< ((shader_programs[4].body_ptr->length() > 0) ? *shader_programs[4].body_ptr : "[not used]")
					<< tcu::TestLog::EndMessage;
		} /* if (validate_status != validate_expected_status) */
		else
		{
			result = true;
		}
	}
	else
	{
		result = true;
	}

end:
	return result;
}